

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *
protobuf_test_messages_proto2_TestAllTypesProto2_mutable_optional_nested_message
          (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,upb_Arena *arena)

{
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *value;
  
  value = protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message(msg);
  if (value == (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)0x0) {
    value = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)
            _upb_Message_New(&
                             protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init
                             ,arena);
    if (value == (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)0x0) {
      value = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)0x0;
    }
    else {
      protobuf_test_messages_proto2_TestAllTypesProto2_set_optional_nested_message(msg,value);
    }
  }
  return value;
}

Assistant:

UPB_INLINE struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* protobuf_test_messages_proto2_TestAllTypesProto2_mutable_optional_nested_message(protobuf_test_messages_proto2_TestAllTypesProto2* msg, upb_Arena* arena) {
  struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* sub = (struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage*)protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message(msg);
  if (sub == NULL) {
    sub = (struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage*)_upb_Message_New(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init, arena);
    if (sub) protobuf_test_messages_proto2_TestAllTypesProto2_set_optional_nested_message(msg, sub);
  }
  return sub;
}